

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool ON_ModelComponent::IsValidComponentNameFirstCodePoint
               (int length,wchar_t *candidate_component_name)

{
  ON__UINT32 local_28;
  undefined1 auStack_24 [4];
  ON__UINT32 unicode_code_point;
  ON_UnicodeErrorParameters e;
  wchar_t *candidate_component_name_local;
  int length_local;
  
  if ((candidate_component_name == (wchar_t *)0x0) || (*candidate_component_name == L'\0')) {
    candidate_component_name_local._7_1_ = false;
  }
  else {
    candidate_component_name_local._0_4_ = length;
    if (length < 0) {
      for (candidate_component_name_local._0_4_ = 0;
          (candidate_component_name[(int)candidate_component_name_local] != L'\0' &&
          ((int)candidate_component_name_local < 9));
          candidate_component_name_local._0_4_ = (int)candidate_component_name_local + 1) {
      }
    }
    _auStack_24 = ON_UnicodeErrorParameters::FailOnErrors._0_8_;
    e.m_error_status = 0;
    local_28 = 0;
    e._4_8_ = candidate_component_name;
    ON_DecodeWideChar(candidate_component_name,(int)candidate_component_name_local,
                      (ON_UnicodeErrorParameters *)auStack_24,&local_28);
    candidate_component_name_local._7_1_ = IsValidComponentNameFirstCodePoint(local_28);
  }
  return candidate_component_name_local._7_1_;
}

Assistant:

bool ON_ModelComponent::IsValidComponentNameFirstCodePoint(
  int length,
  const wchar_t* candidate_component_name
)
{
  if (nullptr == candidate_component_name || 0 == candidate_component_name[0])
    return false;

  if (length < 0)
  {
    for (length = 0; 0 != candidate_component_name[length]; length++)
    {
      if (length > 8)
        break; // 8 elements is plenty for all possible wchar_t encodings.
    }
  }

  ON_UnicodeErrorParameters e = ON_UnicodeErrorParameters::FailOnErrors;
  e.m_error_code_point = 0;
  ON__UINT32 unicode_code_point = 0;
  ON_DecodeWideChar(candidate_component_name, length, &e, &unicode_code_point);
  return ON_ModelComponent::IsValidComponentNameFirstCodePoint(unicode_code_point);
}